

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O1

void __thiscall Assimp::Importer::FreeScene(Importer *this)

{
  aiScene *this_00;
  
  this_00 = this->pimpl->mScene;
  if (this_00 != (aiScene *)0x0) {
    aiScene::~aiScene(this_00);
    operator_delete(this_00,0x80);
  }
  this->pimpl->mScene = (aiScene *)0x0;
  std::__cxx11::string::_M_replace
            ((ulong)&this->pimpl->mErrorString,0,
             (char *)(this->pimpl->mErrorString)._M_string_length,0x7a94f0);
  return;
}

Assistant:

void Importer::FreeScene( )
{
    ASSIMP_BEGIN_EXCEPTION_REGION();

    delete pimpl->mScene;
    pimpl->mScene = NULL;

    pimpl->mErrorString = "";
    ASSIMP_END_EXCEPTION_REGION(void);
}